

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O2

bool __thiscall
GraphContigger::pop_error_bubbble
          (GraphContigger *this,GraphEditor *ge,NodeView *nv1,NodeView *nv2,
          PairedReadsDatastore *peds,int min_support,int max_noise,int snr,bool verbose)

{
  ulong uVar1;
  bool bVar2;
  vector<long,_std::allocator<long>_> *p;
  pointer pNVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  sgNodeID_t node;
  int iVar7;
  ulong uVar8;
  _Vector_base<NodeView,_std::allocator<NodeView>_> local_68;
  GraphEditor *local_50;
  _Vector_base<LinkView,_std::allocator<LinkView>_> local_48;
  
  bVar2 = NodeView::is_bubble_side(nv1);
  if (bVar2) {
    NodeView::parallels((vector<NodeView,_std::allocator<NodeView>_> *)&local_68,nv1);
    uVar1 = (local_68._M_impl.super__Vector_impl_data._M_start)->id;
    if (uVar1 == nv2->id) {
      uVar8 = nv1->id;
      uVar5 = -uVar8;
      if (0 < (long)uVar8) {
        uVar5 = uVar8;
      }
      uVar8 = -uVar1;
      if (0 < (long)uVar1) {
        uVar8 = uVar1;
      }
      std::_Vector_base<NodeView,_std::allocator<NodeView>_>::~_Vector_base(&local_68);
      if (uVar5 <= uVar8) {
        local_50 = ge;
        NodeView::prev((vector<LinkView,_std::allocator<LinkView>_> *)&local_48,nv1);
        iVar4 = 0;
        PairedReadsMapper::all_paths_fw
                  ((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)&local_68,&peds->mapper,
                   ((local_48._M_impl.super__Vector_impl_data._M_start)->node_view).id,false,true);
        std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_48);
        iVar7 = 0;
        iVar6 = 0;
        for (pNVar3 = local_68._M_impl.super__Vector_impl_data._M_start;
            pNVar3 != local_68._M_impl.super__Vector_impl_data._M_finish;
            pNVar3 = (pointer)&pNVar3[1].dg) {
          if (*(long *)pNVar3->id == nv1->id) {
            iVar6 = iVar6 + 1;
          }
          else if (*(long *)pNVar3->id == nv2->id) {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar7 = iVar7 + 1;
          }
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)&local_68);
        NodeView::next((vector<LinkView,_std::allocator<LinkView>_> *)&local_48,nv1);
        PairedReadsMapper::all_paths_fw
                  ((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    *)&local_68,&peds->mapper,
                   -((local_48._M_impl.super__Vector_impl_data._M_start)->node_view).id,false,true);
        std::_Vector_base<LinkView,_std::allocator<LinkView>_>::~_Vector_base(&local_48);
        for (; local_68._M_impl.super__Vector_impl_data._M_start !=
               local_68._M_impl.super__Vector_impl_data._M_finish;
            local_68._M_impl.super__Vector_impl_data._M_start =
                 (pointer)&local_68._M_impl.super__Vector_impl_data._M_start[1].dg) {
          if (*(long *)(local_68._M_impl.super__Vector_impl_data._M_start)->id == -nv1->id) {
            iVar6 = iVar6 + 1;
          }
          else if (*(long *)(local_68._M_impl.super__Vector_impl_data._M_start)->id == -nv2->id) {
            iVar4 = iVar4 + 1;
          }
          else {
            iVar7 = iVar7 + 1;
          }
        }
        std::
        vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   *)&local_68);
        if (((min_support < iVar6) && (iVar4 + iVar7 < max_noise)) &&
           ((iVar4 + iVar7) * snr <= iVar6)) {
          node = nv2->id;
        }
        else {
          if (iVar4 <= min_support) {
            return false;
          }
          if (max_noise <= iVar6 + iVar7) {
            return false;
          }
          if (iVar4 < (iVar6 + iVar7) * snr) {
            return false;
          }
          node = nv1->id;
        }
        GraphEditor::queue_node_deletion(local_50,node);
        return true;
      }
    }
    else {
      std::_Vector_base<NodeView,_std::allocator<NodeView>_>::~_Vector_base(&local_68);
    }
  }
  return false;
}

Assistant:

bool GraphContigger::pop_error_bubbble(GraphEditor& ge, NodeView &nv1, NodeView &nv2, PairedReadsDatastore& peds, int min_support, int max_noise, int snr, bool verbose) {
//    auto nv1(_nv1);
//    auto nv2(_nv2);
    if (!nv1.is_bubble_side()) return false;

    if (nv1.parallels()[0].node_id() != nv2.node_id() or std::abs(nv1.node_id())>std::abs(nv2.node_id())) return false;
    int v1=0;
    int v2=0;
    int vo=0;
    for (const auto&p: peds.mapper.all_paths_fw(nv1.prev()[0].node().node_id(), false)) {
        if (p[0] == nv1.node_id()){
            v1++;
        } else if (p[0] == nv2.node_id()) {
            v2++;
        } else{
            vo++;
        }
    }
    for (const auto &p: peds.mapper.all_paths_fw(-nv1.next()[0].node().node_id(), false)) {
        if (p[0] == -nv1.node_id()) {
            v1++;
        } else if (p[0] == -nv2.node_id()) {
            v2++;
        } else {
            vo++;
        }
    }
    if (v1>min_support and v2+vo<max_noise and v1>=snr*(v2+vo)) {
        ge.queue_node_deletion(nv2.node_id());
        return true;
    }
    if (v2>min_support and v1+vo<max_noise and v2>=snr*(v1+vo)) {
        ge.queue_node_deletion(nv1.node_id());
        return true;
    }
    return false;
}